

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * substExpr(SubstContext *pSubst,Expr *pExpr)

{
  byte *pbVar1;
  u8 uVar2;
  int iVar3;
  int iVar4;
  Select *pSVar5;
  sqlite3 *db;
  Window *pWVar6;
  ExprList *pEVar7;
  Expr *pEVar8;
  CollSeq *pCVar9;
  u8 uVar10;
  Expr *pEVar11;
  uint joinFlag;
  Select *pSVar12;
  char *zC;
  ExprList **ppEVar13;
  ExprList_item *pEVar14;
  long lVar15;
  Expr ifNullRow;
  Expr local_78;
  
  if (pExpr == (Expr *)0x0) {
    return (Expr *)0x0;
  }
  if (((pExpr->flags & 3) != 0) && ((pExpr->w).iJoin == pSubst->iTable)) {
    pExpr->w = (anon_union_4_2_009eaf8f_for_w)pSubst->iNewTable;
  }
  if (pExpr->op == 0xb3) {
    if (pExpr->iTable == pSubst->iTable) {
      pExpr->iTable = pSubst->iNewTable;
    }
LAB_0017d693:
    pEVar8 = substExpr(pSubst,pExpr->pLeft);
    pExpr->pLeft = pEVar8;
    pEVar8 = substExpr(pSubst,pExpr->pRight);
    pExpr->pRight = pEVar8;
    pSVar5 = (Select *)(pExpr->x).pList;
    if ((pExpr->flags & 0x1000) == 0) {
      if ((pSVar5 != (Select *)0x0) &&
         (iVar3._0_1_ = pSVar5->op, iVar3._1_1_ = pSVar5->field_0x1,
         iVar3._2_2_ = pSVar5->nSelectRow, 0 < iVar3)) {
        ppEVar13 = (ExprList **)&pSVar5->iLimit;
        lVar15 = 0;
        do {
          pEVar8 = substExpr(pSubst,(Expr *)*ppEVar13);
          *ppEVar13 = (ExprList *)pEVar8;
          lVar15 = lVar15 + 1;
          iVar4._0_1_ = pSVar5->op;
          iVar4._1_1_ = pSVar5->field_0x1;
          iVar4._2_2_ = pSVar5->nSelectRow;
          ppEVar13 = ppEVar13 + 3;
        } while (lVar15 < iVar4);
      }
    }
    else {
      substSelect(pSubst,pSVar5,1);
    }
    if ((pExpr->flags & 0x1000000) != 0) {
      pWVar6 = (pExpr->y).pWin;
      pEVar8 = substExpr(pSubst,pWVar6->pFilter);
      pWVar6->pFilter = pEVar8;
      pEVar7 = pWVar6->pPartition;
      if ((pEVar7 != (ExprList *)0x0) && (0 < pEVar7->nExpr)) {
        pEVar14 = pEVar7->a;
        lVar15 = 0;
        do {
          pEVar8 = substExpr(pSubst,pEVar14->pExpr);
          pEVar14->pExpr = pEVar8;
          lVar15 = lVar15 + 1;
          pEVar14 = pEVar14 + 1;
        } while (lVar15 < pEVar7->nExpr);
      }
      pEVar7 = pWVar6->pOrderBy;
      if ((pEVar7 != (ExprList *)0x0) && (0 < pEVar7->nExpr)) {
        pEVar14 = pEVar7->a;
        lVar15 = 0;
        do {
          pEVar8 = substExpr(pSubst,pEVar14->pExpr);
          pEVar14->pExpr = pEVar8;
          lVar15 = lVar15 + 1;
          pEVar14 = pEVar14 + 1;
        } while (lVar15 < pEVar7->nExpr);
      }
    }
    return pExpr;
  }
  if (((pExpr->op != 0xa7) || ((pExpr->flags & 0x20) != 0)) || (pExpr->iTable != pSubst->iTable))
  goto LAB_0017d693;
  pSVar5 = (Select *)pSubst->pEList->a[pExpr->iColumn].pExpr;
  uVar2 = pSVar5->op;
  uVar10 = uVar2;
  if (uVar2 == 0xb0) {
    uVar10 = *(u8 *)&pSVar5->nSelectRow;
  }
  pSVar12 = pSVar5;
  if (uVar10 != 0xb1) {
    if (uVar10 != 0x8a) goto LAB_0017d603;
    pSVar12 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar5->pEList)->pSelect;
  }
  if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar12->pEList)->pList->nExpr) {
    sqlite3VectorErrorMsg(pSubst->pParse,(Expr *)pSVar5);
    return pExpr;
  }
LAB_0017d603:
  db = pSubst->pParse->db;
  pSVar12 = pSVar5;
  if ((uVar2 != 0xa7) && (pSubst->isOuterJoin != 0)) {
    local_78.u.zToken = (char *)0x0;
    local_78.pRight = (Expr *)0x0;
    local_78.iColumn = 0;
    local_78.iAgg = 0;
    local_78.w = (anon_union_4_2_009eaf8f_for_w)0x0;
    local_78.pAggInfo = (AggInfo *)0x0;
    local_78.x.pList = (ExprList *)0x0;
    local_78.y.pTab = (Table *)0x0;
    local_78._40_8_ = (ulong)(uint)pSubst->iNewTable << 0x20;
    local_78.op = 0xb3;
    local_78.affExpr = '\0';
    local_78.op2 = '\0';
    local_78._3_1_ = 0;
    local_78.flags = 0x40000;
    pSVar12 = (Select *)&local_78;
    local_78.pLeft = (Expr *)pSVar5;
  }
  pEVar8 = exprDup(db,(Expr *)pSVar12,0,(u8 **)0x0);
  if (db->mallocFailed != '\0') {
    if (pEVar8 == (Expr *)0x0) {
      return pExpr;
    }
    sqlite3ExprDeleteNN(db,pEVar8);
    return pExpr;
  }
  if (pSubst->isOuterJoin != 0) {
    pbVar1 = (byte *)((long)&pEVar8->flags + 2);
    *pbVar1 = *pbVar1 | 0x20;
  }
  joinFlag = pExpr->flags & 3;
  if (joinFlag != 0) {
    sqlite3SetJoinExpr(pEVar8,(pExpr->w).iJoin,joinFlag);
  }
  sqlite3ExprDeleteNN(db,pExpr);
  uVar2 = pEVar8->op;
  if ((uVar2 != 'q') && (uVar2 != 0xa7)) {
    if (uVar2 == 0xaa) {
      pEVar11 = pEVar8;
      if ((pEVar8->flags >> 0xd & 1) != 0) {
        do {
          pEVar11 = pEVar11->pLeft;
        } while ((pEVar11->flags & 0x2000) != 0);
      }
      *(uint *)&pEVar8->u = (uint)((pEVar11->u).zToken[4] == '\0');
      pEVar8->op = 0x9b;
      pEVar8->flags = pEVar8->flags | 0x800;
    }
    pCVar9 = sqlite3ExprCollSeq(pSubst->pParse,pEVar8);
    if (pCVar9 == (CollSeq *)0x0) {
      zC = "BINARY";
    }
    else {
      zC = pCVar9->zName;
    }
    pEVar8 = sqlite3ExprAddCollateString(pSubst->pParse,pEVar8,zC);
    pbVar1 = (byte *)((long)&pEVar8->flags + 1);
    *pbVar1 = *pbVar1 & 0xfd;
    return pEVar8;
  }
  pbVar1 = (byte *)((long)&pEVar8->flags + 1);
  *pbVar1 = *pbVar1 & 0xfd;
  return pEVar8;
}

Assistant:

static Expr *substExpr(
  SubstContext *pSubst,  /* Description of the substitution */
  Expr *pExpr            /* Expr in which substitution occurs */
){
  if( pExpr==0 ) return 0;
  if( ExprHasProperty(pExpr, EP_OuterON|EP_InnerON)
   && pExpr->w.iJoin==pSubst->iTable
  ){
    testcase( ExprHasProperty(pExpr, EP_InnerON) );
    pExpr->w.iJoin = pSubst->iNewTable;
  }
  if( pExpr->op==TK_COLUMN
   && pExpr->iTable==pSubst->iTable
   && !ExprHasProperty(pExpr, EP_FixedCol)
  ){
#ifdef SQLITE_ALLOW_ROWID_IN_VIEW
    if( pExpr->iColumn<0 ){
      pExpr->op = TK_NULL;
    }else
#endif
    {
      Expr *pNew;
      Expr *pCopy = pSubst->pEList->a[pExpr->iColumn].pExpr;
      Expr ifNullRow;
      assert( pSubst->pEList!=0 && pExpr->iColumn<pSubst->pEList->nExpr );
      assert( pExpr->pRight==0 );
      if( sqlite3ExprIsVector(pCopy) ){
        sqlite3VectorErrorMsg(pSubst->pParse, pCopy);
      }else{
        sqlite3 *db = pSubst->pParse->db;
        if( pSubst->isOuterJoin && pCopy->op!=TK_COLUMN ){
          memset(&ifNullRow, 0, sizeof(ifNullRow));
          ifNullRow.op = TK_IF_NULL_ROW;
          ifNullRow.pLeft = pCopy;
          ifNullRow.iTable = pSubst->iNewTable;
          ifNullRow.flags = EP_IfNullRow;
          pCopy = &ifNullRow;
        }
        testcase( ExprHasProperty(pCopy, EP_Subquery) );
        pNew = sqlite3ExprDup(db, pCopy, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pNew);
          return pExpr;
        }
        if( pSubst->isOuterJoin ){
          ExprSetProperty(pNew, EP_CanBeNull);
        }
        if( ExprHasProperty(pExpr,EP_OuterON|EP_InnerON) ){
          sqlite3SetJoinExpr(pNew, pExpr->w.iJoin,
                             pExpr->flags & (EP_OuterON|EP_InnerON));
        }
        sqlite3ExprDelete(db, pExpr);
        pExpr = pNew;
        if( pExpr->op==TK_TRUEFALSE ){
          pExpr->u.iValue = sqlite3ExprTruthValue(pExpr);
          pExpr->op = TK_INTEGER;
          ExprSetProperty(pExpr, EP_IntValue);
        }

        /* Ensure that the expression now has an implicit collation sequence,
        ** just as it did when it was a column of a view or sub-query. */
        if( pExpr->op!=TK_COLUMN && pExpr->op!=TK_COLLATE ){
          CollSeq *pColl = sqlite3ExprCollSeq(pSubst->pParse, pExpr);
          pExpr = sqlite3ExprAddCollateString(pSubst->pParse, pExpr,
              (pColl ? pColl->zName : "BINARY")
          );
        }
        ExprClearProperty(pExpr, EP_Collate);
      }
    }
  }else{
    if( pExpr->op==TK_IF_NULL_ROW && pExpr->iTable==pSubst->iTable ){
      pExpr->iTable = pSubst->iNewTable;
    }
    pExpr->pLeft = substExpr(pSubst, pExpr->pLeft);
    pExpr->pRight = substExpr(pSubst, pExpr->pRight);
    if( ExprUseXSelect(pExpr) ){
      substSelect(pSubst, pExpr->x.pSelect, 1);
    }else{
      substExprList(pSubst, pExpr->x.pList);
    }
#ifndef SQLITE_OMIT_WINDOWFUNC
    if( ExprHasProperty(pExpr, EP_WinFunc) ){
      Window *pWin = pExpr->y.pWin;
      pWin->pFilter = substExpr(pSubst, pWin->pFilter);
      substExprList(pSubst, pWin->pPartition);
      substExprList(pSubst, pWin->pOrderBy);
    }
#endif
  }
  return pExpr;
}